

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O0

int __thiscall Ruleset::getValue(Ruleset *this,Card *c)

{
  CardValue CVar1;
  Card *c_local;
  Ruleset *this_local;
  
  CVar1 = Card::value(c);
  switch(CVar1) {
  case NINE:
    this_local._4_4_ = 0;
    break;
  case JACK:
    this_local._4_4_ = 2;
    break;
  case QUEEN:
    this_local._4_4_ = 3;
    break;
  case KING:
    this_local._4_4_ = 4;
    break;
  case TEN:
    this_local._4_4_ = 10;
    break;
  case ASS:
    this_local._4_4_ = 0xb;
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Ruleset::getValue(const Card &c) {
    switch(c.value()){
        case CardValue::NINE:
            return 0;
        case CardValue::TEN:
            return 10;
        case CardValue::JACK:
            return 2;
        case CardValue::QUEEN:
            return 3;
        case CardValue::KING:
            return 4;
        case CardValue::ASS:
            return 11;
    }
    return 0;
}